

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

double units::readNumericalWords(string *ustring,size_t *index)

{
  double dVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  int iVar4;
  int iVar5;
  size_type sVar6;
  ulong uVar7;
  size_type sVar8;
  long lVar9;
  long lVar10;
  double local_98;
  size_t index_sub;
  double local_80;
  string lcstring;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  double local_38;
  undefined8 uStack_30;
  
  *index = 0;
  if (ustring->_M_string_length < 3) {
    return NAN;
  }
  if ((hasValidNumericalWordStart(std::__cxx11::string_const&)::first_letters_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&hasValidNumericalWordStart(std::__cxx11::string_const&)::
                                   first_letters_abi_cxx11_), iVar4 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               hasValidNumericalWordStart(std::__cxx11::string_const&)::first_letters_abi_cxx11_,
               "otfsenhmbtzaOTFSENHMBTZA",(allocator<char> *)&lcstring);
    __cxa_atexit(std::__cxx11::string::~string,
                 hasValidNumericalWordStart(std::__cxx11::string_const&)::first_letters_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&hasValidNumericalWordStart(std::__cxx11::string_const&)::
                         first_letters_abi_cxx11_);
  }
  if ((hasValidNumericalWordStart(std::__cxx11::string_const&)::second_letters_abi_cxx11_ == '\0')
     && (iVar4 = __cxa_guard_acquire(&hasValidNumericalWordStart(std::__cxx11::string_const&)::
                                      second_letters_abi_cxx11_), iVar4 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               hasValidNumericalWordStart(std::__cxx11::string_const&)::second_letters_abi_cxx11_,
               "nwhoielurNWHOIELUR",(allocator<char> *)&lcstring);
    __cxa_atexit(std::__cxx11::string::~string,
                 hasValidNumericalWordStart(std::__cxx11::string_const&)::second_letters_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&hasValidNumericalWordStart(std::__cxx11::string_const&)::
                         second_letters_abi_cxx11_);
  }
  sVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     hasValidNumericalWordStart(std::__cxx11::string_const&)::
                     first_letters_abi_cxx11_,*(ustring->_M_dataplus)._M_p,0);
  if (sVar6 == 0xffffffffffffffff) {
    return NAN;
  }
  sVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     hasValidNumericalWordStart(std::__cxx11::string_const&)::
                     second_letters_abi_cxx11_,(ustring->_M_dataplus)._M_p[1],0);
  if (sVar6 == 0xffffffffffffffff) {
    return NAN;
  }
  std::__cxx11::string::string
            ((string *)&lcstring,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ustring);
  sVar3 = lcstring._M_string_length;
  _Var2 = lcstring._M_dataplus;
  for (sVar8 = 0; sVar3 != sVar8; sVar8 = sVar8 + 1) {
    iVar4 = tolower((int)_Var2._M_p[sVar8]);
    _Var2._M_p[sVar8] = (char)iVar4;
  }
  for (lVar9 = 0; lVar9 != 0x90; lVar9 = lVar9 + 0x18) {
    sVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lcstring,
                 *(char **)(&DAT_0047b580 + lVar9),0);
    if (sVar6 != 0xffffffffffffffff) {
      if (sVar6 == 0) {
        index_sub = 0;
        local_98 = *(double *)((long)&DAT_0047b578 + lVar9);
        sVar6 = (size_type)*(int *)((long)&groupNumericalWords + lVar9);
        *index = sVar6;
        if (sVar6 < lcstring._M_string_length) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          substr(&local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lcstring,
                 sVar6,0xffffffffffffffff);
          local_80 = readNumericalWords((string *)&local_58,&index_sub);
          std::__cxx11::string::~string((string *)&local_58);
          if (!NAN(local_80)) {
            local_98 = (double)(~-(ulong)(local_80 < local_98) & (ulong)(local_98 * local_80) |
                               (ulong)(local_98 + local_80) & -(ulong)(local_80 < local_98));
            *index = *index + index_sub;
          }
        }
      }
      else {
        index_sub = 0;
        local_80 = *(double *)((long)&DAT_0047b578 + lVar9);
        uVar7 = (long)*(int *)((long)&groupNumericalWords + lVar9) + sVar6;
        *index = uVar7;
        local_38 = 0.0;
        uStack_30 = 0;
        if (uVar7 < lcstring._M_string_length) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          substr(&local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lcstring,
                 uVar7,0xffffffffffffffff);
          dVar1 = readNumericalWords((string *)&local_58,&index_sub);
          std::__cxx11::string::~string((string *)&local_58);
          if (!NAN(dVar1)) {
            local_38 = (double)(-(ulong)(dVar1 < local_80) & (ulong)dVar1);
            uStack_30 = 0;
            if (local_80 <= dVar1) {
              local_80 = local_80 * dVar1;
            }
            *index = *index + index_sub;
          }
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lcstring,0,
                   sVar6);
        local_98 = readNumericalWords((string *)&local_58,&index_sub);
        std::__cxx11::string::~string((string *)&local_58);
        if ((NAN(local_98)) || (index_sub < sVar6)) {
          *index = index_sub;
        }
        else {
          local_98 = local_38 + local_80 * local_98;
        }
      }
      goto LAB_0031bc7f;
    }
  }
  iVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lcstring,0,3
                  ,"and");
  if (iVar4 == 0) {
    *index = *index + 3;
  }
  lVar9 = 0;
  do {
    lVar10 = lVar9;
    if (lVar10 == 0xc0) {
      lVar9 = -0x10;
      goto LAB_0031bc2b;
    }
    iVar4 = *(int *)((long)&decadeWords + lVar10);
    iVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lcstring,
                    *index,(long)iVar4,
                    *(char **)((long)&PTR_anon_var_dwarf_16e7424_0047b610 + lVar10));
    lVar9 = lVar10 + 0x18;
  } while (iVar5 != 0);
  uVar7 = (long)iVar4 + *index;
  local_98 = *(double *)((long)&DAT_0047b608 + lVar10);
  *index = uVar7;
  if (uVar7 < lcstring._M_string_length) {
    if (lcstring._M_dataplus._M_p[uVar7] == '-') {
      *index = uVar7 + 1;
    }
    dVar1 = read1To10(&lcstring,index);
    local_98 = (double)((ulong)local_98 & -(ulong)NAN(dVar1) |
                       ~-(ulong)NAN(dVar1) & (ulong)(local_98 + dVar1));
  }
  goto LAB_0031bc7f;
  while( true ) {
    iVar4 = *(int *)((long)&DAT_0047b7a8 + lVar10);
    iVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lcstring,
                    *index,(long)iVar4,*(char **)(&UNK_0047b7b8 + lVar10));
    lVar9 = lVar10 + 0x18;
    if (iVar5 == 0) break;
LAB_0031bc2b:
    lVar10 = lVar9;
    if (lVar10 == 0xf8) goto LAB_0031bc68;
  }
  *index = *index + (long)iVar4;
  local_98 = *(double *)((long)&DAT_0047b7b0 + lVar10);
  if (NAN(local_98)) {
LAB_0031bc68:
    local_98 = read1To10(&lcstring,index);
  }
LAB_0031bc7f:
  std::__cxx11::string::~string((string *)&lcstring);
  return local_98;
}

Assistant:

static double readNumericalWords(const std::string& ustring, size_t& index)
{
    double val = constants::invalid_conversion;
    index = 0;
    if (ustring.size() < 3) {
        return val;
    }
    if (!hasValidNumericalWordStart(ustring)) {
        return val;
    }
    std::string lcstring{ustring};
    // make the string lower case for consistency
    std::transform(
        lcstring.begin(), lcstring.end(), lcstring.begin(), ::tolower);
    for (const auto& wp : groupNumericalWords) {
        auto loc = lcstring.find(std::get<0>(wp));
        if (loc != std::string::npos) {
            if (loc == 0) {
                size_t index_sub{0};
                val = std::get<1>(wp);
                index = std::get<2>(wp);
                if (index < lcstring.size()) {
                    double val_p2 =
                        readNumericalWords(lcstring.substr(index), index_sub);
                    if (!std::isnan(val_p2)) {
                        if (val_p2 >= val) {
                            val = val * val_p2;
                        } else {
                            val += val_p2;
                        }

                        index += index_sub;
                    }
                }
                return val;
            }
            size_t index_sub{0};
            val = std::get<1>(wp);
            index = loc + std::get<2>(wp);
            // read the next component
            double val_add{0.0};
            if (index < lcstring.size()) {
                val_add = readNumericalWords(lcstring.substr(index), index_sub);
                if (!std::isnan(val_add)) {
                    if (val_add >= val) {
                        val = val * val_add;
                        val_add = 0.0;
                    }
                    index += index_sub;
                } else {
                    val_add = 0.0;
                }
            }
            // read the previous part
            double val_p2 =
                readNumericalWords(lcstring.substr(0, loc), index_sub);
            if (std::isnan(val_p2) || index_sub < loc) {
                index = index_sub;
                return val_p2;
            }
            val *= val_p2;
            val += val_add;
            return val;
        }
    }
    // clean up "and"
    if (lcstring.compare(0, 3, "and") == 0) {
        index += 3;
    }
    // what we are left with is values below a hundred
    for (const auto& wp : decadeWords) {
        if (lcstring.compare(index, std::get<2>(wp), std::get<0>(wp)) == 0) {
            val = std::get<1>(wp);
            index += std::get<2>(wp);
            if (lcstring.size() > index) {
                if (lcstring[index] == '-') {
                    ++index;
                }
                double toTen = read1To10(lcstring, index);
                if (!std::isnan(toTen)) {
                    val += toTen;
                }
            }
            return val;
        }
    }
    val = readTeens(lcstring, index);
    if (!std::isnan(val)) {
        return val;
    }
    val = read1To10(lcstring, index);
    return val;
}